

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::HasProperty(RecyclableObject *instance,PropertyId propertyId)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  
  if (((instance->type).ptr)->typeId != TypeIds_Null) {
    pTVar6 = &instance->type;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xb])(instance,propertyId,0);
      if (iVar4 != 0) {
        return (uint)(iVar4 == 1);
      }
      pTVar1 = pTVar6->ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00aa91c5:
        instance = (pTVar1->prototype).ptr;
      }
      else if (pTVar1->typeId == TypeIds_Proxy) {
        instance = (pTVar1->prototype).ptr;
        if (instance !=
            (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
              ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.
            ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
          goto LAB_00aa91c5;
        }
      }
      else {
        iVar4 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(instance);
        instance = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      }
      pTVar6 = &instance->type;
    } while (((instance->type).ptr)->typeId != TypeIds_Null);
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::HasProperty(RecyclableObject* instance, PropertyId propertyId)
    {
        while (!JavascriptOperators::IsNull(instance))
        {
            PropertyQueryFlags result = instance->HasPropertyQuery(propertyId, nullptr /*info*/);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result); // return false if instance is typed array and HasPropertyQuery() returns PropertyQueryFlags::Property_Found_Undefined
            }

            instance = JavascriptOperators::GetPrototypeNoTrap(instance);
        }
        return false;
    }